

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O1

iterator __thiscall
phmap::priv::
base_checker<phmap::btree_set<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>
::upper_bound(base_checker<phmap::btree_set<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>
              *this,key_type *key)

{
  _Rb_tree_const_iterator<std::pair<int,_int>_> checker_iter;
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  long lVar3;
  iterator tree_iter;
  iterator iVar5;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>
  bVar4;
  
  tree_iter = btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
              ::upper_bound<std::pair<int,int>>
                        ((btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
                          *)this,key);
  p_Var1 = (this->checker_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  checker_iter._M_node = &(this->checker_)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var1 != (_Base_ptr)0x0) {
    p_Var2 = checker_iter._M_node;
    do {
      lVar3 = 0x10;
      checker_iter._M_node = p_Var1;
      if (((int)p_Var1[1]._M_color <= key->first) &&
         (((int)p_Var1[1]._M_color < key->first || (*(int *)&p_Var1[1].field_0x4 <= key->second))))
      {
        lVar3 = 0x18;
        checker_iter._M_node = p_Var2;
      }
      p_Var1 = *(_Base_ptr *)((long)&p_Var1->_M_color + lVar3);
      p_Var2 = checker_iter._M_node;
    } while (p_Var1 != (_Base_ptr)0x0);
  }
  bVar4 = base_checker<phmap::btree_set<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>,std::set<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>>
          ::
          iter_check<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>,std::pair<int,int>&,std::pair<int,int>*>,std::_Rb_tree_const_iterator<std::pair<int,int>>>
                    ((base_checker<phmap::btree_set<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>,std::set<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>>
                      *)this,tree_iter,checker_iter);
  iVar5.node = bVar4.node;
  iVar5.position = bVar4.position;
  iVar5._12_4_ = bVar4._12_4_;
  return iVar5;
}

Assistant:

iterator upper_bound(const key_type &key) {
        return iter_check(tree_.upper_bound(key), checker_.upper_bound(key));
    }